

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevutil.cpp
# Opt level: O0

ParsedSpecification * QEvdevUtil::parseSpecification(QString *specification)

{
  QLatin1StringView s;
  bool bVar1;
  const_iterator o;
  QStringBuilder<const_QStringView_&,_char16_t> *this;
  ParsedSpecification *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QStringBuilder<const_QStringView_&,_char16_t> QVar3;
  QStringView *arg;
  add_const_t<QList<QStringView>_> *__range1;
  ParsedSpecification *result;
  const_iterator __end1;
  const_iterator __begin1;
  QStringView *in_stack_ffffffffffffff18;
  ParsedSpecification *in_stack_ffffffffffffff20;
  ParsedSpecification *this_00;
  QStringBuilder<const_QStringView_&,_char16_t> *b;
  QList<QStringView> *a;
  const_iterator local_50;
  QChar local_42;
  undefined1 local_40 [16];
  undefined1 local_30 [24];
  QStringView *local_18;
  char16_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x48);
  ParsedSpecification::ParsedSpecification(in_stack_ffffffffffffff20);
  QStringView::QStringView<QString,_true>((QStringView *)this_00,&in_RDI->spec);
  QChar::QChar<char16_t,_true>(&local_42,L':');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffff20,
             (SplitBehaviorFlags)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  QStringView::split((QChar)(char16_t)local_30,(QFlags_conflict *)local_40,
                     (uint)(ushort)local_42.ucs);
  QList<QStringView>::operator=
            ((QList<QStringView> *)in_stack_ffffffffffffff20,
             (QList<QStringView> *)in_stack_ffffffffffffff18);
  QList<QStringView>::~QList((QList<QStringView> *)0x10d7b4);
  a = &this_00->args;
  local_50.i = (QStringView *)0xaaaaaaaaaaaaaaaa;
  local_50 = QList<QStringView>::begin((QList<QStringView> *)in_stack_ffffffffffffff20);
  o = QList<QStringView>::end((QList<QStringView> *)in_stack_ffffffffffffff20);
  while (bVar1 = QList<QStringView>::const_iterator::operator!=(&local_50,o), bVar1) {
    this = (QStringBuilder<const_QStringView_&,_char16_t> *)
           QList<QStringView>::const_iterator::operator*(&local_50);
    b = this;
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this);
    s.m_data = (char *)b;
    s.m_size = (qsizetype)QVar2.m_data;
    bVar1 = QStringView::startsWith(in_stack_ffffffffffffff18,s,CaseInsensitive);
    if (bVar1) {
      in_stack_ffffffffffffff18 = (QStringView *)&this_00->devices;
      QStringView::toString((QStringView *)this);
      QList<QString>::append((QList<QString> *)this,(rvalue_ref)in_stack_ffffffffffffff18);
      QString::~QString((QString *)0x10d8da);
    }
    else {
      QVar3 = operator+((QStringView *)in_RDI,(char16_t *)this);
      local_18 = QVar3.a;
      local_10 = QVar3.b;
      operator+=((QString *)a,b);
    }
    QList<QStringView>::const_iterator::operator++(&local_50);
  }
  bVar1 = QString::isEmpty((QString *)0x10d946);
  if (!bVar1) {
    QString::chop((longlong)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

ParsedSpecification parseSpecification(const QString &specification)
{
    ParsedSpecification result;

    result.args = QStringView{specification}.split(u':');

    for (const auto &arg : std::as_const(result.args)) {
        if (arg.startsWith("/dev/"_L1)) {
            // if device is specified try to use it
            result.devices.append(arg.toString());
#ifdef Q_OS_VXWORKS
        } else if (arg.startsWith("/input/"_L1)) {
            result.devices.append(arg.toString());
#endif
        } else {
            // build new specification without /dev/ elements
            result.spec += arg + u':';
        }
    }

    if (!result.spec.isEmpty())
        result.spec.chop(1); // remove trailing ':'

    return result;
}